

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotorTorque.cpp
# Opt level: O2

void __thiscall
chrono::ChShaftsMotorTorque::ArchiveOUT(ChShaftsMotorTorque *this,ChArchiveOut *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChShaftsMotorTorque>(marchive);
  ChShaftsMotorBase::ArchiveOUT(&this->super_ChShaftsMotorBase,marchive);
  local_28._value = &this->f_torque;
  local_28._name = "f_torque";
  local_28._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_28);
  return;
}

Assistant:

void ChShaftsMotorTorque::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChShaftsMotorTorque>();

    // serialize parent class
    ChShaftsMotorBase::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(f_torque);
}